

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O0

bool __thiscall
YAML::detail::node::equals<std::__cxx11::string>
          (node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs,
          shared_memory_holder *pMemory)

{
  byte bVar1;
  node *in_RDX;
  Node *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lhs;
  Node *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [2];
  string local_40 [63];
  __type local_1;
  
  std::__cxx11::string::string(local_40);
  __rhs = local_90;
  std::shared_ptr<YAML::detail::memory_holder>::shared_ptr
            ((shared_ptr<YAML::detail::memory_holder> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (shared_ptr<YAML::detail::memory_holder> *)in_stack_ffffffffffffff38);
  Node::Node(in_RDI,in_RDX,
             (shared_memory_holder *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  bVar1 = convert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::decode(in_stack_ffffffffffffff38,(string *)0x9dfb9a);
  Node::~Node((Node *)CONCAT17(bVar1,in_stack_ffffffffffffff40));
  std::shared_ptr<YAML::detail::memory_holder>::~shared_ptr
            ((shared_ptr<YAML::detail::memory_holder> *)0x9dfbb4);
  if ((bVar1 & 1) == 0) {
    local_1 = false;
  }
  else {
    local_1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),__rhs);
  }
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool node::equals(const T& rhs, shared_memory_holder pMemory) {
  T lhs;
  if (convert<T>::decode(Node(*this, pMemory), lhs)) {
    return lhs == rhs;
  }
  return false;
}